

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo_tests.cpp
# Opt level: O0

void density_tests::lifo_tests
               (QueueTesterFlags i_flags,ostream *i_output,uint32_t i_random_seed,size_t i_depth,
               size_t i_fork_depth)

{
  bool bVar1;
  uint64_t uVar2;
  char *i_label;
  ThreadEntry *thread_entry_1;
  iterator __end1;
  iterator __begin1;
  vector<ThreadEntry,_std::allocator<ThreadEntry>_> *__range1;
  ostream *local_1498;
  value_type *local_1490;
  size_t local_1488;
  QueueTesterFlags local_1480;
  size_t local_1478;
  size_t local_1470;
  thread local_1468;
  reference local_1460;
  EasyRandom *thread_random;
  value_type *thread_entry;
  size_t thread_index_1;
  size_t thread_index;
  vector<ThreadEntry,_std::allocator<ThreadEntry>_> threads;
  size_t thread_count;
  uint64_t affinity_mask;
  bool reserve_core1_to_main;
  uint64_t num_of_processors;
  EasyRandom main_random;
  ScopedLeakCheck local_68;
  ScopedLeakCheck scoped_leak_check;
  PrintScopeDuration duration;
  size_t i_fork_depth_local;
  size_t i_depth_local;
  uint32_t i_random_seed_local;
  ostream *i_output_local;
  QueueTesterFlags i_flags_local;
  
  bVar1 = operator&&(i_flags,eTestExceptions);
  i_label = "lifo_tests";
  if (bVar1) {
    i_label = "lifo_tests with exceptions";
  }
  PrintScopeDuration::PrintScopeDuration((PrintScopeDuration *)&scoped_leak_check,i_output,i_label);
  InstanceCounted::ScopedLeakCheck::ScopedLeakCheck(&local_68);
  if (i_random_seed == 0) {
    EasyRandom::EasyRandom((EasyRandom *)&num_of_processors);
  }
  else {
    EasyRandom::EasyRandom((EasyRandom *)&num_of_processors,i_random_seed);
  }
  uVar2 = get_num_of_processors();
  bVar1 = operator&&(i_flags,eReserveCoreToMainThread);
  thread_count = std::numeric_limits<unsigned_long>::max();
  if (bVar1 && 3 < uVar2) {
    thread_count = thread_count - 2;
  }
  threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x6;
  std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::vector
            ((vector<ThreadEntry,_std::allocator<ThreadEntry>_> *)&thread_index);
  std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::reserve
            ((vector<ThreadEntry,_std::allocator<ThreadEntry>_> *)&thread_index,6);
  for (thread_index_1 = 0; thread_index_1 < 6; thread_index_1 = thread_index_1 + 1) {
    std::
    vector<density_tests::lifo_tests(density_tests::QueueTesterFlags,std::ostream&,unsigned_int,unsigned_long,unsigned_long)::ThreadEntry,std::allocator<density_tests::lifo_tests(density_tests::QueueTesterFlags,std::ostream&,unsigned_int,unsigned_long,unsigned_long)::ThreadEntry>>
    ::emplace_back<density_tests::EasyRandom&>
              ((vector<density_tests::lifo_tests(density_tests::QueueTesterFlags,std::ostream&,unsigned_int,unsigned_long,unsigned_long)::ThreadEntry,std::allocator<density_tests::lifo_tests(density_tests::QueueTesterFlags,std::ostream&,unsigned_int,unsigned_long,unsigned_long)::ThreadEntry>>
                *)&thread_index,(EasyRandom *)&num_of_processors);
  }
  for (thread_entry = (value_type *)0x0; thread_entry < (value_type *)0x6;
      thread_entry = (value_type *)((long)(thread_entry->m_random).m_rand._M_x + 1)) {
    __range1 = (vector<ThreadEntry,_std::allocator<ThreadEntry>_> *)
               std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::operator[]
                         ((vector<ThreadEntry,_std::allocator<ThreadEntry>_> *)&thread_index,
                          (size_type)thread_entry);
    local_1490 = thread_entry;
    local_1488 = thread_count;
    local_1498 = i_output;
    local_1480 = i_flags;
    local_1478 = i_depth;
    local_1470 = i_fork_depth;
    local_1460 = (reference)__range1;
    thread_random = (EasyRandom *)__range1;
    std::thread::
    thread<density_tests::lifo_tests(density_tests::QueueTesterFlags,std::ostream&,unsigned_int,unsigned_long,unsigned_long)::__0,,void>
              (&local_1468,(type *)&__range1);
    std::thread::operator=((thread *)(thread_random + 1),&local_1468);
    std::thread::~thread(&local_1468);
  }
  __end1 = std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::begin
                     ((vector<ThreadEntry,_std::allocator<ThreadEntry>_> *)&thread_index);
  thread_entry_1 =
       (ThreadEntry *)
       std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::end
                 ((vector<ThreadEntry,_std::allocator<ThreadEntry>_> *)&thread_index);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<ThreadEntry_*,_std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>_>
                                     *)&thread_entry_1), bVar1) {
    __gnu_cxx::
    __normal_iterator<ThreadEntry_*,_std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<ThreadEntry_*,_std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>_>::
    operator++(&__end1);
  }
  std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::~vector
            ((vector<ThreadEntry,_std::allocator<ThreadEntry>_> *)&thread_index);
  InstanceCounted::ScopedLeakCheck::~ScopedLeakCheck(&local_68);
  PrintScopeDuration::~PrintScopeDuration((PrintScopeDuration *)&scoped_leak_check);
  return;
}

Assistant:

void lifo_tests(
      QueueTesterFlags i_flags,
      std::ostream &   i_output,
      uint32_t         i_random_seed,
      size_t           i_depth,
      size_t           i_fork_depth)
    {
        PrintScopeDuration duration(
          i_output,
          i_flags && QueueTesterFlags::eTestExceptions ? "lifo_tests with exceptions"
                                                       : "lifo_tests");

        /* this checks that TestObject's don't leak. Note: the instance counting is not thread local, so we have to scope the thread
            procedures inside it. */
        InstanceCounted::ScopedLeakCheck scoped_leak_check;

        EasyRandom main_random = i_random_seed == 0 ? EasyRandom() : EasyRandom(i_random_seed);

        auto const num_of_processors = get_num_of_processors();
        bool const reserve_core1_to_main =
          (i_flags && QueueTesterFlags::eReserveCoreToMainThread) && num_of_processors >= 4;
        uint64_t affinity_mask = std::numeric_limits<uint64_t>::max();
        if (reserve_core1_to_main)
            affinity_mask -= 2;

        // create thread entries - here we pay the cost of forking the random generator
        const size_t thread_count = 6;
        struct ThreadEntry
        {
            EasyRandom  m_random;
            std::thread m_thread;
            ThreadEntry(EasyRandom & i_main_random) : m_random(i_main_random.fork()) {}
        };
        std::vector<ThreadEntry> threads;
        threads.reserve(thread_count);
        for (size_t thread_index = 0; thread_index < thread_count; thread_index++)
        {
            threads.emplace_back(main_random);
        }

#ifdef DENSITY_USER_DATA_STACK
        density::user_data_stack::stats_header(i_output);
#endif

        // start threads
        for (size_t thread_index = 0; thread_index < thread_count; thread_index++)
        {
            auto & thread_entry   = threads[thread_index];
            auto & thread_random  = thread_entry.m_random;
            thread_entry.m_thread = std::thread([&thread_random,
                                                 &i_output,
                                                 thread_index,
                                                 affinity_mask,
                                                 i_flags,
                                                 i_depth,
                                                 i_fork_depth] {
                set_thread_affinity(affinity_mask);

                lifo_test_thread_proc(i_flags, thread_random, i_depth, i_fork_depth);

                std::ostringstream thread_name_stream;
                thread_name_stream << "thread " << thread_index;
                std::string thread_name = thread_name_stream.str();

                std::ostringstream stats_stream;
#ifdef DENSITY_USER_DATA_STACK
                density::user_data_stack::stats_print(stats_stream, thread_name.c_str());
#else
                stats_stream << thread_name << " has finished\n";
#endif
                i_output << stats_stream.str();
                i_output.flush();
            });
        }

        // join threads
        for (auto & thread_entry : threads)
        {
            thread_entry.m_thread.join();
        }
    }